

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

bool __thiscall Js::DynamicType::LockTypeOnly(DynamicType *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  DynamicType *this_local;
  
  bVar2 = GetIsLocked(this);
  if (bVar2) {
    pDVar5 = GetTypeHandler(this);
    iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[4])();
    if (iVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x42,"(this->GetTypeHandler()->IsLockable())",
                                  "this->GetTypeHandler()->IsLockable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local._7_1_ = true;
  }
  else {
    pDVar5 = GetTypeHandler(this);
    iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[4])();
    if (iVar3 == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->isLocked = true;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicType::LockTypeOnly()
    {
        if (GetIsLocked())
        {
            Assert(this->GetTypeHandler()->IsLockable());
            return true;
        }
        if (this->GetTypeHandler()->IsLockable())
        {
            this->isLocked = true;
            return true;
        }
        return false;
    }